

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Name *pNVar3;
  MixedArena *this_00;
  undefined8 uVar4;
  Name *pNVar5;
  long lVar6;
  ulong uVar7;
  
  pNVar3 = this->data;
  this_00 = (MixedArena *)this[1].data;
  this->allocatedElements = size;
  pNVar5 = (Name *)MixedArena::allocSpace(this_00,size << 4,8);
  this->data = pNVar5;
  if (this->usedElements != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pNVar3->super_IString).str._M_len + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < this->usedElements);
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }